

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

exr_result_t
exr_register_attr_type_handler
          (exr_context_t ctxt,char *type,
          _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr
          *unpack_func_ptr,
          _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *pack_func_ptr,
          _func_void_exr_context_t_void_ptr_int32_t *destroy_unpacked_func_ptr)

{
  _priv_exr_context_t _Var1;
  uint uVar2;
  long lVar3;
  exr_attribute_t *peVar4;
  exr_result_t eVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  exr_attribute_t *ent;
  _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *local_60;
  _func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *local_58;
  _func_void_exr_context_t_void_ptr_int32_t *local_50;
  exr_context_t local_48;
  ulong local_40;
  ulong local_38;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar5 = 2;
  }
  else {
    local_60 = unpack_func_ptr;
    local_58 = pack_func_ptr;
    local_50 = destroy_unpacked_func_ptr;
    if ((type == (char *)0x0) || (*type == '\0')) {
      eVar5 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid type to register_attr_handler");
      return eVar5;
    }
    _Var1 = ctxt[2];
    sVar7 = strlen(type);
    if ((byte)_Var1 < sVar7) {
      eVar5 = (**(code **)(ctxt + 0x48))
                        (ctxt,0xc,"Provided type name \'%s\' too long for file (len %d, max %d)",
                         type,sVar7 & 0xffffffff,_Var1);
      return eVar5;
    }
    iVar6 = internal_exr_is_standard_type(type);
    if (iVar6 != 0) {
      eVar5 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"Provided type name \'%s\' is a reserved / internal type name",type,
                         *(code **)(ctxt + 0x48));
      return eVar5;
    }
    eVar5 = exr_attr_list_find_by_name(ctxt,(exr_attribute_list_t *)(ctxt + 0x1e0),type,&ent);
    if (eVar5 == 0) {
      pcVar8 = "Attribute handler for \'%s\' previously registered";
      eVar5 = 3;
    }
    else {
      ent = (exr_attribute_t *)0x0;
      eVar5 = exr_attr_list_add_by_type
                        (ctxt,(exr_attribute_list_t *)(ctxt + 0x1e0),type,type,0,(uint8_t **)0x0,
                         &ent);
      if (eVar5 == 0) {
        ((ent->field_6).m33d)->m[4] = (double)local_60;
        ((ent->field_6).m33d)->m[5] = (double)local_58;
        ((ent->field_6).m33d)->m[6] = (double)local_50;
        local_40 = (ulong)*(uint *)(ctxt + 0xc4);
        if ((int)*(uint *)(ctxt + 0xc4) < 1) {
          local_40 = 0;
        }
        local_48 = ctxt;
        for (local_38 = 0; local_38 != local_40; local_38 = local_38 + 1) {
          lVar3 = *(long *)(*(long *)(local_48 + 0x1d8) + local_38 * 8);
          uVar2 = *(uint *)(lVar3 + 8);
          uVar9 = (ulong)uVar2;
          if ((int)uVar2 < 1) {
            uVar9 = 0;
          }
          for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
            peVar4 = *(exr_attribute_t **)(*(long *)(lVar3 + 0x10) + uVar10 * 8);
            if ((sVar7 == peVar4->type_name_length) &&
               (ent = peVar4, iVar6 = strcmp(peVar4->type_name,type), iVar6 == 0)) {
              ((peVar4->field_6).m33d)->m[4] = (double)local_60;
              ((peVar4->field_6).m33d)->m[5] = (double)local_58;
              ((peVar4->field_6).m33d)->m[6] = (double)local_50;
            }
          }
        }
        return 0;
      }
      pcVar8 = "Unable to register custom handler for type \'%s\'";
    }
    eVar5 = (**(code **)(ctxt + 0x48))(ctxt,eVar5,pcVar8,type);
  }
  return eVar5;
}

Assistant:

exr_result_t
exr_register_attr_type_handler (
    exr_context_t ctxt,
    const char*   type,
    exr_result_t (*unpack_func_ptr) (
        exr_context_t ctxt,
        const void*   data,
        int32_t       attrsize,
        int32_t*      outsize,
        void**        outbuffer),
    exr_result_t (*pack_func_ptr) (
        exr_context_t ctxt,
        const void*   data,
        int32_t       datasize,
        int32_t*      outsize,
        void*         outbuffer),
    void (*destroy_unpacked_func_ptr) (
        exr_context_t ctxt, void* data, int32_t datasize))
{
    exr_attribute_t*      ent;
    exr_result_t          rv;
    int32_t               tlen, mlen = EXR_SHORTNAME_MAXLEN;
    size_t                slen;
    exr_attribute_list_t* curattrs;

    EXR_PROMOTE_LOCKED_CONTEXT_OR_ERROR (ctxt);

    mlen = (int32_t) pctxt->max_name_length;

    if (!type || type[0] == '\0')
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid type to register_attr_handler"));

    slen = strlen (type);
    if (slen > (size_t) mlen)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided type name '%s' too long for file (len %d, max %d)",
            type,
            (int) slen,
            mlen));
    tlen = (int32_t) slen;

    if (internal_exr_is_standard_type (type))
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Provided type name '%s' is a reserved / internal type name",
            type));

    rv = exr_attr_list_find_by_name (
        ctxt, &(pctxt->custom_handlers), type, &ent);
    if (rv == EXR_ERR_SUCCESS)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Attribute handler for '%s' previously registered",
            type));

    ent = NULL;
    rv  = exr_attr_list_add_by_type (
        ctxt, &(pctxt->custom_handlers), type, type, 0, NULL, &ent);
    if (rv != EXR_ERR_SUCCESS)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            rv,
            "Unable to register custom handler for type '%s'",
            type));

    ent->opaque->unpack_func_ptr           = unpack_func_ptr;
    ent->opaque->pack_func_ptr             = pack_func_ptr;
    ent->opaque->destroy_unpacked_func_ptr = destroy_unpacked_func_ptr;

    for (int p = 0; p < pctxt->num_parts; ++p)
    {
        curattrs = &(pctxt->parts[p]->attributes);
        if (curattrs)
        {
            int nattr = curattrs->num_attributes;
            for (int a = 0; a < nattr; ++a)
            {
                ent = curattrs->entries[a];
                if (ent->type_name_length == tlen &&
                    0 == strcmp (ent->type_name, type))
                {
                    ent->opaque->unpack_func_ptr = unpack_func_ptr;
                    ent->opaque->pack_func_ptr   = pack_func_ptr;
                    ent->opaque->destroy_unpacked_func_ptr =
                        destroy_unpacked_func_ptr;
                }
            }
        }
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}